

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHDivConstantBound.cpp
# Opt level: O3

void TPZShapeHDivConstantBound<pzshape::TPZShapeLinear>::Initialize
               (TPZVec<long> *ids,int connectorder,int sideorient,TPZShapeData *data)

{
  TPZManVector<int,_27> *this;
  int local_2c;
  
  local_2c = connectorder + 1;
  TPZManVector<int,_20>::Resize(&data->fSideOrient,1);
  *(data->fSideOrient).super_TPZVec<int>.fStore = sideorient;
  this = &data->fH1ConnectOrders;
  TPZManVector<int,_27>::Resize(this,1,&local_2c);
  TPZVec<int>::Fill(&this->super_TPZVec<int>,&local_2c,0,-1);
  TPZShapeH1<pzshape::TPZShapeLinear>::Initialize(ids,&this->super_TPZVec<int>,data);
  return;
}

Assistant:

void TPZShapeHDivConstantBound<TSHAPE>::Initialize(const TPZVec<int64_t> &ids,
                                           int connectorder, int sideorient,
                                           TPZShapeData &data) {
    const int ncorner = TSHAPE::NCornerNodes;
    const int nsides = TSHAPE::NSides;
#ifdef PZDEBUG
    if(ids.size() != ncorner || connectorder < 0 || std::abs(sideorient) != 1)
    {
        DebugStop();
    }
#endif
    if(TSHAPE::Type() == ETriangle || TSHAPE::Type() == EOned) connectorder++;

    data.fSideOrient.Resize(1);
    data.fSideOrient[0] = sideorient;
    data.fH1ConnectOrders.Resize(nsides-ncorner, connectorder);
    data.fH1ConnectOrders.Fill(connectorder);

    if(TSHAPE::Dimension == 1)
    {
        TPZShapeH1<TSHAPE>::Initialize(ids,data.fH1ConnectOrders,data);
    } else if (TSHAPE::Dimension == 2){
        const int nedges = TSHAPE::NSides-TSHAPE::NFacets-TSHAPE::NCornerNodes-1;
        TPZManVector<int,15> locconorders(TSHAPE::NSides-TSHAPE::NCornerNodes,1);
        for(int ic = nedges; ic<TSHAPE::NSides-TSHAPE::NCornerNodes; ic++)
        {
            locconorders[ic] = data.fH1ConnectOrders[ic-nedges];
        }
        TPZShapeHCurlNoGrads<TSHAPE>::Initialize(ids,locconorders,data);
    } else {
        DebugStop();
    }
}